

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.h
# Opt level: O1

void __thiscall Threadpool<Searchthread>::thread_func(Threadpool<Searchthread> *this)

{
  undefined8 uVar1;
  unique_lock<std::mutex> lock;
  value_type fn;
  unique_lock<std::mutex> local_68;
  deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *local_58;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  local_58 = &this->tasks;
  do {
    local_68._M_owns = false;
    local_68._M_device = &this->m;
    std::unique_lock<std::mutex>::lock(&local_68);
    local_68._M_owns = true;
    while ((((this->stop)._M_base._M_i & 1U) == 0 &&
           ((this->tasks).
            super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur ==
            (this->tasks).
            super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
            _M_impl.super__Deque_impl_data._M_start._M_cur))) {
      std::condition_variable::wait((unique_lock *)&this->cv_task);
    }
    if ((this->tasks).
        super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur ==
        (this->tasks).
        super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur) {
      if (((this->stop)._M_base._M_i & 1U) != 0) {
        std::unique_lock<std::mutex>::~unique_lock(&local_68);
        return;
      }
    }
    else {
      LOCK();
      (this->busy).super___atomic_base<unsigned_int>._M_i =
           (this->busy).super___atomic_base<unsigned_int>._M_i + 1;
      UNLOCK();
      std::function<void_()>::function
                ((function<void_()> *)&local_50,
                 (this->tasks).
                 super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur);
      std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::pop_front
                (local_58);
      std::unique_lock<std::mutex>::unlock(&local_68);
      if (local_40 == (code *)0x0) {
        uVar1 = std::__throw_bad_function_call();
        __clang_call_terminate(uVar1);
      }
      (*local_38)(&local_50);
      LOCK();
      (this->processed).super___atomic_base<unsigned_int>._M_i =
           (this->processed).super___atomic_base<unsigned_int>._M_i + 1;
      UNLOCK();
      std::unique_lock<std::mutex>::lock(&local_68);
      LOCK();
      (this->busy).super___atomic_base<unsigned_int>._M_i =
           (this->busy).super___atomic_base<unsigned_int>._M_i - 1;
      UNLOCK();
      std::condition_variable::notify_one();
      if (local_40 != (code *)0x0) {
        (*local_40)(&local_50,&local_50,__destroy_functor);
      }
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_68);
  } while( true );
}

Assistant:

void thread_func() {
		while (true) {
			std::unique_lock<std::mutex> lock(m);
			cv_task.wait(lock, [this]() { return stop || !tasks.empty(); });
			if (!tasks.empty()) {
				++busy;
				auto fn = tasks.front();
				tasks.pop_front();
				lock.unlock();
				fn();
				++processed;
				lock.lock();
				--busy;
				cv_finished.notify_one();
			}
			else if (stop) break;
		}
	}